

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O0

string * __thiscall
OpenMPExtImplementationDefinedRequirementClause::toString_abi_cxx11_
          (string *__return_storage_ptr__,OpenMPExtImplementationDefinedRequirementClause *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  string ext_user_defined_implementation;
  string parameter_string;
  allocator<char> local_1a;
  byte local_19;
  OpenMPExtImplementationDefinedRequirementClause *local_18;
  OpenMPExtImplementationDefinedRequirementClause *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (OpenMPExtImplementationDefinedRequirementClause *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  std::__cxx11::string::string((string *)(ext_user_defined_implementation.field_2._M_local_buf + 8))
  ;
  getImplementationDefinedRequirement_abi_cxx11_((string *)local_70,this);
  std::operator+(&local_90,"ext_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ");
  local_19 = 1;
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string
            ((string *)(ext_user_defined_implementation.field_2._M_local_buf + 8));
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPExtImplementationDefinedRequirementClause::toString() {
    std::string result = "";
    std::string parameter_string;

    std::string ext_user_defined_implementation = this->getImplementationDefinedRequirement();
    result += "ext_" + ext_user_defined_implementation;
    result += " ";
    return result;
}